

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O1

char * xml_print_ns(xmlpr_ctx *pctx,char *ns,char *new_prefix,uint32_t prefix_opts)

{
  int iVar1;
  LY_ERR LVar2;
  char *pcVar3;
  lyd_node *plVar4;
  ulong uVar5;
  uint local_3c;
  char *local_38;
  
  local_3c = (pctx->ns).count;
  uVar5 = (ulong)local_3c;
  local_38 = new_prefix;
  if (uVar5 != 0) {
    do {
      if (new_prefix == (char *)0x0) {
        if ((pctx->prefix).field_2.dnodes[uVar5 - 1] == (lyd_node *)0x0) {
          iVar1 = strcmp((char *)(pctx->ns).field_2.dnodes[uVar5 - 1],ns);
          if (iVar1 == 0) goto LAB_0013d2ef;
          break;
        }
      }
      else {
        iVar1 = strcmp((char *)(pctx->ns).field_2.dnodes[uVar5 - 1],ns);
        if ((iVar1 == 0) &&
           (plVar4 = (pctx->prefix).field_2.dnodes[uVar5 - 1], plVar4 != (lyd_node *)0x0)) {
          iVar1 = strcmp((char *)plVar4,new_prefix);
          if ((prefix_opts & 1) == 0) {
            return (char *)plVar4;
          }
          if (iVar1 == 0) {
            return (char *)plVar4;
          }
        }
      }
      uVar5 = uVar5 - 1;
      local_3c = (uint)uVar5;
    } while (local_3c != 0);
  }
  pcVar3 = ":";
  if (new_prefix == (char *)0x0) {
    pcVar3 = "";
    new_prefix = "";
  }
  ly_print_(pctx->out," xmlns%s%s=\"%s\"",pcVar3,new_prefix,ns);
  if ((local_38 != (char *)0x0) &&
     (LVar2 = lydict_insert(pctx->ctx,local_38,0,&local_38), LVar2 != LY_SUCCESS)) {
    return (char *)0x0;
  }
  plVar4 = (lyd_node *)0x0;
  LVar2 = ly_set_add(&pctx->prefix,local_38,'\x01',(uint32_t *)0x0);
  if (LVar2 == LY_SUCCESS) {
    LVar2 = ly_set_add(&pctx->ns,ns,'\x01',&local_3c);
    if (LVar2 == LY_SUCCESS) {
      plVar4 = (pctx->prefix).field_2.dnodes[local_3c];
    }
    else {
LAB_0013d2ef:
      plVar4 = (lyd_node *)0x0;
    }
  }
  return (char *)plVar4;
}

Assistant:

static const char *
xml_print_ns(struct xmlpr_ctx *pctx, const char *ns, const char *new_prefix, uint32_t prefix_opts)
{
    uint32_t i;

    for (i = pctx->ns.count; i > 0; --i) {
        if (!new_prefix) {
            /* find default namespace */
            if (!pctx->prefix.objs[i - 1]) {
                if (!strcmp(pctx->ns.objs[i - 1], ns)) {
                    /* matching default namespace */
                    return pctx->prefix.objs[i - 1];
                }
                /* not matching default namespace */
                break;
            }
        } else {
            /* find prefixed namespace */
            if (!strcmp(pctx->ns.objs[i - 1], ns)) {
                if (!pctx->prefix.objs[i - 1]) {
                    /* default namespace is not interesting */
                    continue;
                }

                if (!strcmp(pctx->prefix.objs[i - 1], new_prefix) || !(prefix_opts & LYXML_PREFIX_REQUIRED)) {
                    /* the same prefix or can be any */
                    return pctx->prefix.objs[i - 1];
                }
            }
        }
    }

    /* suitable namespace not found, must be printed */
    ly_print_(pctx->out, " xmlns%s%s=\"%s\"", new_prefix ? ":" : "", new_prefix ? new_prefix : "", ns);

    /* and added into namespaces */
    if (new_prefix) {
        LY_CHECK_RET(lydict_insert(pctx->ctx, new_prefix, 0, &new_prefix), NULL);
    }
    LY_CHECK_RET(ly_set_add(&pctx->prefix, (void *)new_prefix, 1, NULL), NULL);
    LY_CHECK_RET(ly_set_add(&pctx->ns, (void *)ns, 1, &i), NULL);

    /* return it */
    return pctx->prefix.objs[i];
}